

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O2

lzma_index * lzma_index_dup(lzma_index *src,lzma_allocator *allocator)

{
  index_tree_node *piVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  lzma_index *i;
  index_stream *node;
  index_tree_node *piVar6;
  index_tree_node *piVar7;
  index_tree_node *node_00;
  lzma_vli lVar8;
  
  i = index_init_plain(allocator);
  if (i == (lzma_index *)0x0) {
LAB_004a8284:
    i = (lzma_index *)0x0;
  }
  else {
    lVar8 = src->total_size;
    i->uncompressed_size = src->uncompressed_size;
    i->total_size = lVar8;
    lVar8 = src->index_list_size;
    i->record_count = src->record_count;
    i->index_list_size = lVar8;
    node_00 = (src->streams).leftmost;
    do {
      if ((0xffffffffffffffb < node_00[2].compressed_base) ||
         (node = index_stream_init(node_00->compressed_base,node_00->uncompressed_base,
                                   (ulong)(uint)node_00[1].uncompressed_base,
                                   node_00[1].compressed_base,allocator),
         node == (index_stream *)0x0)) {
LAB_004a8279:
        lzma_index_end(i,allocator);
        goto LAB_004a8284;
      }
      if (node_00[1].left != (index_tree_node *)0x0) {
        lVar8 = node_00[2].compressed_base;
        piVar6 = node_00[2].parent;
        node->record_count = node_00[2].compressed_base;
        node->index_list_size = (lzma_vli)piVar6;
        piVar6 = node_00[2].right;
        uVar2 = *(undefined4 *)&node_00[3].uncompressed_base;
        uVar3 = *(undefined4 *)((long)&node_00[3].uncompressed_base + 4);
        uVar4 = *(undefined4 *)&node_00[3].compressed_base;
        uVar5 = *(undefined4 *)((long)&node_00[3].compressed_base + 4);
        piVar7 = node_00[3].parent;
        piVar1 = node_00[3].left;
        *(index_tree_node **)&node->stream_flags = node_00[2].left;
        (node->stream_flags).backward_size = (lzma_vli)piVar6;
        (node->stream_flags).check = uVar2;
        (node->stream_flags).reserved_enum1 = uVar3;
        (node->stream_flags).reserved_enum2 = uVar4;
        (node->stream_flags).reserved_enum3 = uVar5;
        *(index_tree_node **)&(node->stream_flags).reserved_enum4 = piVar7;
        *(index_tree_node **)&(node->stream_flags).reserved_bool5 = piVar1;
        *(index_tree_node **)&(node->stream_flags).reserved_int2 = node_00[3].right;
        node->stream_padding = node_00[4].uncompressed_base;
        piVar6 = (index_tree_node *)lzma_alloc(lVar8 * 0x10 + 0x40,allocator);
        if (piVar6 == (index_tree_node *)0x0) {
          index_stream_end(node,allocator);
          goto LAB_004a8279;
        }
        piVar6->uncompressed_base = 0;
        piVar6->compressed_base = 0;
        piVar6[1].uncompressed_base = 1;
        lVar8 = node_00[2].compressed_base;
        piVar6[1].compressed_base = lVar8;
        piVar6[1].parent = (index_tree_node *)(lVar8 - 1);
        piVar7 = node_00[1].left;
        lVar8 = 0;
        do {
          piVar1 = piVar7[1].parent;
          memcpy(&piVar6[1].left + lVar8 * 2,&piVar7[1].left,(long)piVar1 * 0x10 + 0x10);
          lVar8 = (long)&piVar1->uncompressed_base + lVar8 + 1;
          piVar7 = (index_tree_node *)index_tree_next(piVar7);
        } while (piVar7 != (index_tree_node *)0x0);
        if (lVar8 != piVar6[1].compressed_base) {
          __assert_fail("i == destg->allocated",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/common/index.c"
                        ,0x3a6,
                        "index_stream *index_dup_stream(const index_stream *, lzma_allocator *)");
        }
        index_tree_append(&node->groups,piVar6);
      }
      index_tree_append(&i->streams,&node->node);
      node_00 = (index_tree_node *)index_tree_next(node_00);
    } while (node_00 != (index_tree_node *)0x0);
  }
  return i;
}

Assistant:

extern LZMA_API(lzma_index *)
lzma_index_dup(const lzma_index *src, lzma_allocator *allocator)
{
	index_stream *srcstream;
	index_stream *deststream;

	// Allocate the base structure (no initial Stream).
	lzma_index *dest = index_init_plain(allocator);
	if (dest == NULL)
		return NULL;

	// Copy the totals.
	dest->uncompressed_size = src->uncompressed_size;
	dest->total_size = src->total_size;
	dest->record_count = src->record_count;
	dest->index_list_size = src->index_list_size;

	// Copy the Streams and the groups in them.
	srcstream = (index_stream *)(src->streams.leftmost);
	do {
		deststream = index_dup_stream(srcstream, allocator);
		if (deststream == NULL) {
			lzma_index_end(dest, allocator);
			return NULL;
		}

		index_tree_append(&dest->streams, &deststream->node);

		srcstream = index_tree_next(&srcstream->node);
	} while (srcstream != NULL);

	return dest;
}